

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

bool __thiscall
vkt::memory::anon_unknown_0::MemoryTestInstance::nextIteration(MemoryTestInstance *this)

{
  bool bVar1;
  ulong uVar2;
  
  uVar2 = this->m_iteration + 1;
  this->m_iteration = uVar2;
  if (uVar2 < this->m_iterationCount) {
    resetResources(this);
    this->m_stage = (StageFunc)createCommandsAndAllocateMemory;
    *(undefined8 *)&this->field_0x258 = 0;
    return true;
  }
  bVar1 = nextMemoryType(this);
  return bVar1;
}

Assistant:

bool MemoryTestInstance::nextIteration (void)
{
	m_iteration++;

	if (m_iteration < m_iterationCount)
	{
		resetResources();
		m_stage = &MemoryTestInstance::createCommandsAndAllocateMemory;
		return true;
	}
	else
		return nextMemoryType();
}